

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sampler.cpp
# Opt level: O2

Vector3f __thiscall blinnPhong::sample(blinnPhong *this,Ray *ray,Hit *h)

{
  float fVar1;
  float fVar2;
  int iVar3;
  unsigned_long __res;
  float *pfVar4;
  long in_RCX;
  Vector3f *pVVar5;
  Vector3f *rv;
  bool bVar6;
  result_type_conflict rVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  double dVar11;
  undefined8 uVar12;
  undefined8 extraout_XMM0_Qa;
  Vector3f VVar13;
  float local_110;
  float local_10c;
  float local_100;
  Vector3f local_fc;
  Hit *local_f0;
  Vector3f *local_e8;
  Vector3f local_dc;
  Vector3f *local_d0;
  Vector3f local_c4;
  double local_b8;
  Vector3f y;
  Vector3f x;
  Vector3f normal;
  Vector3f local_88;
  Vector3f local_7c;
  param_type local_70;
  default_random_engine generator;
  Vector3f local_60;
  Vector3f local_54;
  Vector3f spec;
  Vector3f diff;
  undefined4 extraout_XMM0_Db;
  
  local_b8 = (double)CONCAT44(local_b8._4_4_,(*(Vector3f **)(in_RCX + 8))[4].m_elements[0]);
  local_f0 = h;
  Vector3f::Vector3f(&diff,*(Vector3f **)(in_RCX + 8));
  Vector3f::Vector3f(&spec,(Vector3f *)(*(long *)(in_RCX + 8) + 0xc));
  pfVar4 = Vector3f::operator[](&diff,0);
  fVar8 = *pfVar4;
  pfVar4 = Vector3f::operator[](&diff,1);
  fVar9 = *pfVar4;
  pfVar4 = Vector3f::operator[](&diff,2);
  fVar10 = *pfVar4;
  pfVar4 = Vector3f::operator[](&spec,0);
  fVar1 = *pfVar4;
  pfVar4 = Vector3f::operator[](&spec,1);
  fVar2 = *pfVar4;
  pfVar4 = Vector3f::operator[](&spec,2);
  local_e8 = (Vector3f *)
             CONCAT44(local_e8._4_4_,
                      1.0 / ((fVar8 + fVar9 + fVar10) / (fVar1 + fVar2 + *pfVar4) + 1.0));
  iVar3 = rand();
  generator._M_x = (ulong)(long)iVar3 % 0x7fffffff + (ulong)((ulong)(long)iVar3 % 0x7fffffff == 0);
  local_70._M_a = 0.0;
  local_70._M_b = 1.0;
  local_110 = std::uniform_real_distribution<float>::operator()
                        ((uniform_real_distribution<float> *)&local_70,&generator);
  rVar7 = std::uniform_real_distribution<float>::operator()
                    ((uniform_real_distribution<float> *)&local_70,&generator);
  local_100 = rVar7 * 6.2831855;
  dVar11 = sin((double)local_100);
  local_10c = (float)dVar11;
  dVar11 = cos((double)local_100);
  fVar8 = (float)dVar11;
  Vector3f::Vector3f(&normal,0.0);
  Vector3f::Vector3f(&x,0.0);
  Vector3f::Vector3f(&y,0.0);
  pVVar5 = (Vector3f *)(in_RCX + 0x10);
  Vector3f::Vector3f(&local_fc,pVVar5);
  local_d0 = (Vector3f *)this;
  operator-(&local_fc);
  rVar7 = std::uniform_real_distribution<float>::operator()
                    ((uniform_real_distribution<float> *)&local_70,&generator);
  if (rVar7 <= local_e8._0_4_) {
    rv = (Vector3f *)((long)&local_f0->material + 4);
    Vector3f::Vector3f(&local_c4,rv);
    Vector3f::Vector3f(&local_7c,rv);
    Vector3f::Vector3f(&local_88,pVVar5);
    fVar9 = Vector3f::dot(&local_7c,&local_88);
    local_f0 = (Hit *)CONCAT44(local_f0._4_4_,fVar9 + fVar9);
    local_e8 = pVVar5;
    Vector3f::Vector3f(&local_54,pVVar5);
    ::operator*(local_f0._0_4_,&local_60);
    operator-(&local_c4,&local_60);
    Vector3f::normalized(&local_dc);
    Vector3f::operator=(&normal,&local_fc);
    Vector3f::Vector3f(&local_c4,1.0,2.0,3.0);
    Vector3f::cross(&local_c4,&normal);
    Vector3f::normalized(&local_dc);
    Vector3f::operator=(&x,&local_fc);
    Vector3f::cross(&x,&normal);
    Vector3f::normalized(&local_dc);
    Vector3f::operator=(&y,&local_fc);
    local_b8 = (double)(1.0 / (local_b8._0_4_ + 1.0));
    iVar3 = 10;
    while (bVar6 = iVar3 != 0, iVar3 = iVar3 + -1, bVar6) {
      dVar11 = pow((double)local_110,local_b8);
      fVar9 = (float)dVar11;
      fVar10 = 1.0 - fVar9 * fVar9;
      if (fVar10 < 0.0) {
        local_f0 = (Hit *)CONCAT44(local_f0._4_4_,fVar9);
        fVar10 = sqrtf(fVar10);
        fVar9 = local_f0._0_4_;
      }
      else {
        fVar10 = SQRT(fVar10);
      }
      ::operator*(fVar9,&local_dc);
      ::operator*(local_10c,&local_7c);
      ::operator*(fVar8,&local_88);
      operator+(&local_7c,&local_88);
      ::operator*(fVar10,&local_c4);
      operator+(&local_dc,&local_c4);
      pVVar5 = local_d0;
      Vector3f::operator=(local_d0,&local_fc);
      Vector3f::Vector3f(&local_fc,local_e8);
      fVar8 = Vector3f::dot(pVVar5,&local_fc);
      uVar12 = CONCAT44(extraout_XMM0_Db,fVar8);
      fVar9 = 0.0;
      if (0.0 < fVar8) goto LAB_001242f7;
      local_110 = std::uniform_real_distribution<float>::operator()
                            ((uniform_real_distribution<float> *)&local_70,&generator);
      dVar11 = fmod((double)local_100 + 0.4,6.283185307179586);
      local_100 = (float)dVar11;
      dVar11 = sin((double)local_100);
      local_10c = (float)dVar11;
      dVar11 = cos((double)local_100);
      fVar8 = (float)dVar11;
    }
    if (local_110 < 0.0) {
      local_100 = sqrtf(local_110);
    }
    else {
      local_100 = SQRT(local_110);
    }
    pVVar5 = local_e8;
    local_110 = 1.0 - local_100 * local_100;
    if (local_110 < 0.0) {
      local_110 = sqrtf(local_110);
    }
    else {
      local_110 = SQRT(local_110);
    }
  }
  else {
    if (local_110 < 0.0) {
      local_100 = sqrtf(local_110);
    }
    else {
      local_100 = SQRT(local_110);
    }
    local_110 = 1.0 - local_100 * local_100;
    if (local_110 < 0.0) {
      local_110 = sqrtf(local_110);
    }
    else {
      local_110 = SQRT(local_110);
    }
  }
  Vector3f::Vector3f(&local_fc,pVVar5);
  Vector3f::operator=(&normal,&local_fc);
  Vector3f::Vector3f(&local_c4,1.0,2.0,3.0);
  Vector3f::cross(&local_c4,&normal);
  Vector3f::normalized(&local_dc);
  Vector3f::operator=(&x,&local_fc);
  Vector3f::cross(&x,&normal);
  Vector3f::normalized(&local_dc);
  Vector3f::operator=(&y,&local_fc);
  ::operator*(local_100,&local_dc);
  ::operator*(local_10c,&local_7c);
  ::operator*(fVar8,&local_88);
  operator+(&local_7c,&local_88);
  ::operator*(local_110,&local_c4);
  VVar13 = operator+(&local_dc,&local_c4);
  fVar9 = VVar13.m_elements[2];
  Vector3f::operator=(local_d0,&local_fc);
  uVar12 = extraout_XMM0_Qa;
LAB_001242f7:
  VVar13.m_elements[2] = fVar9;
  VVar13.m_elements[0] = (float)(int)uVar12;
  VVar13.m_elements[1] = (float)(int)((ulong)uVar12 >> 0x20);
  return (Vector3f)VVar13.m_elements;
}

Assistant:

Vector3f blinnPhong::sample(const Ray &ray, Hit &h) const {
    float shininess = h.getMaterial()->getShininess();
    Vector3f diff = h.getMaterial()->getDiffuseColor();
    Vector3f spec = h.getMaterial()->getSpecularColor();
    float prob_spec = 1.f / (1.f + (diff[0] + diff[1] + diff[2]) / (spec[0] + spec[1] + spec[2]));
    int max_iters = 10;

    std::default_random_engine generator(rand());
    std::uniform_real_distribution<float> uniform(0.f, 1.f);

    float u = uniform(generator);
    float v = 2.f * (float)M_PI * uniform(generator);
    float sin_v = sin(v);
    float cos_v = cos(v);

    float r;
    float factor;
    Vector3f normal;
    Vector3f x;
    Vector3f y;
    Vector3f output = -h.getNormal();

    if (uniform(generator) > prob_spec) {
        // do diffuse distribution
        r = sqrt(u);
        factor = sqrt(1-r*r);
        normal = h.getNormal();

        x = Vector3f::cross(Vector3f(1., 2., 3.), normal).normalized();
        y = Vector3f::cross(x, normal).normalized();
        output = r * normal + factor * (sin_v * x + cos_v * y);
    } else {
        // do specular distribution
        normal = (ray.getDirection() -
                  2 * Vector3f::dot(ray.getDirection(), h.getNormal()) * h.getNormal()).normalized();
        x = Vector3f::cross(Vector3f(1., 2., 3.), normal).normalized();
        y = Vector3f::cross(x, normal).normalized();

        for (int i=0; i<max_iters; i++) {
            r = pow(u, 1.f / (1.f + shininess));
            factor = sqrt(1 - r * r);
            output = r * normal + factor * (sin_v * x + cos_v * y);

            if (Vector3f::dot(output, h.getNormal()) > 0) {
                return output;
            }

            u = uniform(generator);
            v = fmod(v + 0.4, 2 * M_PI);
            sin_v = sin(v); cos_v = cos(v);
        }

        r = sqrt(u);
        factor = sqrt(1-r*r);
        normal = h.getNormal();
        x = Vector3f::cross(Vector3f(1., 2., 3.), normal).normalized();
        y = Vector3f::cross(x, normal).normalized();
        output = r * normal + factor * (sin_v * x + cos_v * y);
    }

    return output;
}